

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_write_keys_histoe
              (fitsfile *fptr,fitsfile *histptr,int naxis,int *colnum,char (*colname) [71],
              char **colexpr,int *status)

{
  int in_EDX;
  long in_R8;
  long in_R9;
  double dvalue;
  char svalue [71];
  char keyname [75];
  int tstatus;
  int ii;
  int *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff44;
  fitsfile *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  fitsfile *in_stack_ffffffffffffff88;
  undefined4 local_3c;
  undefined4 local_4;
  
  if (*(int *)dvalue < 1) {
    for (local_3c = 0; local_3c < in_EDX; local_3c = local_3c + 1) {
      if ((((in_R9 == 0) || (*(long *)(in_R9 + (long)local_3c * 8) == 0)) ||
          (**(char **)(in_R9 + (long)local_3c * 8) == '\0')) || (in_R8 + (long)local_3c * 0x47 == 0)
         ) {
        ffkeyn((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38
               ,in_stack_ffffffffffffff30);
        ffgky(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
              in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      }
      else {
        ffkeyn((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38
               ,in_stack_ffffffffffffff30);
        ffpky(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
              in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        ffkeyn((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38
               ,in_stack_ffffffffffffff30);
        ffpky(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
              in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        ffkeyn((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38
               ,in_stack_ffffffffffffff30);
        ffpky(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
              in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        ffkeyn((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38
               ,in_stack_ffffffffffffff30);
        ffpky(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
              in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      }
    }
    local_4 = *(int *)dvalue;
  }
  else {
    local_4 = *(int *)dvalue;
  }
  return local_4;
}

Assistant:

int fits_write_keys_histoe(
      fitsfile *fptr,   /* I - pointer to table to be binned              */
      fitsfile *histptr,  /* I - pointer to output histogram image HDU      */
      int naxis,        /* I - number of axes in the histogram image      */
      int *colnum,      /* I - column numbers (array length = naxis)      */
      char colname[4][FLEN_VALUE], /* I - if expression, then column name to use */
      char *colexpr[4], /* I - if expression, then column name to use */
      int *status)     
{      
   /*  Write default WCS keywords in the output histogram image header */
   /*  if the keywords do not already exist.   */

    int ii, tstatus;
    char keyname[FLEN_KEYWORD], svalue[FLEN_VALUE];
    double dvalue;
    
    if (*status > 0)
        return(*status);

    for (ii = 0; ii < naxis; ii++)
    {
       /*  CTYPEn  */
       tstatus = 0;

       if (colexpr && colexpr[ii] && colexpr[ii][0] && colname[ii]) 
       {
	 /* Column expression: we need to put the column name from the binning expression */
         ffkeyn("CTYPE", ii + 1, keyname, &tstatus);
         ffpky(histptr, TSTRING, keyname, colname[ii], "Coordinate Type", &tstatus);
       }
       else
       {
	 /* Column name */
	 tstatus = 0;
	 ffkeyn("CTYPE", ii+1, keyname, &tstatus);
	 ffgky(histptr, TSTRING, keyname, svalue, NULL, &tstatus);
	 
	 if (!tstatus) continue;  /* keyword already exists, so skip to next axis */

	 /* use column name as the axis name */
	 tstatus = 0;
	 ffkeyn("TTYPE", colnum[ii], keyname, &tstatus);
	 ffgky(fptr, TSTRING, keyname, svalue, NULL, &tstatus);
	 
	 if (!tstatus)
	   {
	     ffkeyn("CTYPE", ii + 1, keyname, &tstatus);
	     ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Type", &tstatus);
	   }
	 
	 /*  CUNITn,  use the column units */
	 tstatus = 0;
	 ffkeyn("TUNIT", colnum[ii], keyname, &tstatus);
	 ffgky(fptr, TSTRING, keyname, svalue, NULL, &tstatus);
	 
	 if (!tstatus)
	   {
	     ffkeyn("CUNIT", ii + 1, keyname, &tstatus);
	     ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Units", &tstatus);
	   }
       }

       /*  CRPIXn  - Reference Pixel choose first pixel in new image as ref. pix. */
       dvalue = 1.0;
       tstatus = 0;
       ffkeyn("CRPIX", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Pixel", &tstatus);

       /*  CRVALn - Value at the location of the reference pixel */
       dvalue = 1.0;
       tstatus = 0;
       ffkeyn("CRVAL", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Value", &tstatus);

       /*  CDELTn - unit size of pixels  */
       dvalue = 1.0;  
       tstatus = 0;
       dvalue = 1.;
       ffkeyn("CDELT", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Pixel size", &tstatus);

    }
    return(*status);
}